

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O3

uint __thiscall ON_MeshNgon::BoundaryEdgeCount(ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list)

{
  bool bVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  ON_2udex *pOVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint *puVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ON_SimpleArray<ON_2udex> edge_buffer;
  ON_SimpleArray<ON_2udex> local_48;
  
  uVar13 = 0;
  if (((this->m_Fcount != 0) && (this->m_fi != (uint *)0x0)) &&
     (uVar14 = mesh_face_list->m_face_count, uVar14 != 0)) {
    uVar13 = uVar14 * 4;
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00814eb0;
    local_48.m_a = (ON_2udex *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    if ((uVar14 & 0x3fffffff) == 0) {
      iVar6 = 0;
    }
    else {
      ON_SimpleArray<ON_2udex>::SetCapacity(&local_48,(ulong)uVar13);
      iVar6 = local_48.m_capacity;
    }
    pOVar5 = local_48.m_a;
    if ((-1 < (int)(uVar14 << 2)) && ((int)uVar13 <= iVar6)) {
      local_48.m_count = uVar13;
    }
    if (this->m_Fcount == 0) {
      uVar14 = 0;
    }
    else {
      puVar11 = this->m_fi;
      puVar2 = mesh_face_list->m_faces;
      bVar1 = mesh_face_list->m_bQuadFaces;
      uVar9 = 0;
      uVar14 = 0;
      do {
        if (puVar11[uVar9] < mesh_face_list->m_face_count) {
          uVar12 = (ulong)(puVar11[uVar9] * mesh_face_list->m_face_stride);
          uVar13 = puVar2[uVar12 + 2];
          uVar10 = uVar13;
          if ((bVar1 & 1U) != 0) {
            uVar10 = puVar2[uVar12 + 3];
          }
          uVar8 = puVar2[uVar12];
          uVar7 = puVar2[uVar12 + 1];
          if (uVar10 != uVar8) {
            uVar3 = uVar8;
            if (uVar10 < uVar8) {
              uVar3 = uVar10;
            }
            uVar4 = uVar8;
            if (uVar8 < uVar10) {
              uVar4 = uVar10;
            }
            local_48.m_a[uVar14].i = uVar3;
            local_48.m_a[uVar14].j = uVar4;
            uVar14 = uVar14 + 1;
          }
          if (uVar8 != uVar7) {
            uVar3 = uVar7;
            if (uVar8 < uVar7) {
              uVar3 = uVar8;
            }
            if (uVar8 <= uVar7) {
              uVar8 = uVar7;
            }
            local_48.m_a[uVar14].i = uVar3;
            local_48.m_a[uVar14].j = uVar8;
            uVar14 = uVar14 + 1;
          }
          if (uVar7 != uVar13) {
            uVar8 = uVar13;
            if (uVar7 < uVar13) {
              uVar8 = uVar7;
            }
            if (uVar7 <= uVar13) {
              uVar7 = uVar13;
            }
            local_48.m_a[uVar14].i = uVar8;
            local_48.m_a[uVar14].j = uVar7;
            uVar14 = uVar14 + 1;
          }
          if (uVar13 != uVar10) {
            uVar8 = uVar10;
            if (uVar13 < uVar10) {
              uVar8 = uVar13;
            }
            if (uVar10 < uVar13) {
              uVar10 = uVar13;
            }
            local_48.m_a[uVar14].i = uVar8;
            local_48.m_a[uVar14].j = uVar10;
            uVar14 = uVar14 + 1;
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < this->m_Fcount);
    }
    ON_qsort(local_48.m_a,(ulong)uVar14,8,Internal_compare_ngon_edges);
    if (uVar14 == 0) {
      uVar13 = 0;
    }
    else {
      uVar10 = 0;
      uVar13 = 0;
      do {
        uVar7 = uVar10 + 1;
        uVar8 = uVar7;
        if (uVar7 < uVar14) {
          puVar11 = &pOVar5[(ulong)uVar10 + 1].j;
          while ((((ON_2udex *)(puVar11 + -1))->i == pOVar5[uVar10].i &&
                 (*puVar11 == pOVar5[uVar10].j))) {
            uVar8 = uVar8 + 1;
            puVar11 = puVar11 + 2;
            if (uVar14 == uVar8) {
              uVar13 = uVar13 + (uVar7 == uVar14);
              goto LAB_0052330c;
            }
          }
        }
        uVar10 = uVar8;
        uVar13 = uVar13 + (uVar7 == uVar10);
      } while (uVar10 < uVar14);
    }
LAB_0052330c:
    ON_SimpleArray<ON_2udex>::~ON_SimpleArray(&local_48);
  }
  return uVar13;
}

Assistant:

unsigned int ON_MeshNgon::BoundaryEdgeCount(const ON_MeshFaceList & mesh_face_list) const
{
  if (m_Fcount <= 0 || nullptr == m_fi)
    return 0;
  const unsigned int mesh_face_count = mesh_face_list.FaceCount();
  if (mesh_face_count <= 0)
    return 0;

  const unsigned int edge_capacity = 4 * mesh_face_count;
  ON_SimpleArray<ON_2udex> edge_buffer(edge_capacity);
  edge_buffer.SetCount(edge_capacity);
  ON_2udex* edges = edge_buffer.Array();
  unsigned int edge_count = 0;
  unsigned int face_vi[4];

  ON_2udex e;
  for (unsigned int i = 0; i < m_Fcount; i++)
  {
    mesh_face_list.QuadFvi(m_fi[i], face_vi);
    e.j = face_vi[3];
    for (unsigned int j = 0; j < 4; j++)
    {
      e.i = e.j;
      e.j = face_vi[j];
      if (e.i == e.j)
        continue;
      if (e.i < e.j)
      {
        edges[edge_count] = e;
      }
      else
      {
        edges[edge_count].i = e.j;
        edges[edge_count].j = e.i;
      }
      edge_count++;
    }
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]), Internal_compare_ngon_edges);
  unsigned int boundary_edge_count = 0;

  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    e = edges[i++];
    const unsigned int i1 = i;
    for (/*empty init*/; i < edge_count; i++)
    {
      if (edges[i].i != e.i || edges[i].j != e.j)
        break;
    }
    if (i1 == i)
      boundary_edge_count++;
  }

  return boundary_edge_count;
}